

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_probe_bw.cc
# Opt level: O1

void __thiscall quic::Bbr2ProbeBwMode::RaiseInflightHighSlope(Bbr2ProbeBwMode *this)

{
  uint64_t uVar1;
  Bbr2Sender *this_00;
  ulong uVar2;
  QuicByteCount QVar3;
  ulong uVar4;
  
  uVar1 = (this->cycle_).probe_up_rounds;
  this_00 = (this->super_Bbr2ModeBase).sender_;
  uVar4 = uVar1 + 1;
  uVar2 = 0x1e;
  if (uVar4 < 0x1e) {
    uVar2 = uVar4;
  }
  (this->cycle_).probe_up_rounds = uVar2;
  QVar3 = Bbr2Sender::GetCongestionWindow(this_00);
  uVar4 = QVar3 / (ulong)(long)(1 << ((byte)uVar1 & 0x1f));
  uVar2 = 0x5b4;
  if (0x5b4 < uVar4) {
    uVar2 = uVar4;
  }
  (this->cycle_).probe_up_bytes = uVar2;
  return;
}

Assistant:

void Bbr2ProbeBwMode::RaiseInflightHighSlope() {
 /* DCHECK_EQ(cycle_.phase, CyclePhase::PROBE_UP);*/
  uint64_t growth_this_round = 1 << cycle_.probe_up_rounds;
  // The number 30 below means |growth_this_round| is capped at 1G and the lower
  // bound of |probe_up_bytes| is (practically) 1 mss, at this speed inflight_hi
  // grows by approximately 1 packet per packet acked.
  cycle_.probe_up_rounds = std::min<uint64_t>(cycle_.probe_up_rounds + 1, 30);
  uint64_t probe_up_bytes = sender_->GetCongestionWindow() / growth_this_round;
  cycle_.probe_up_bytes =
      std::max<QuicByteCount>(probe_up_bytes, kDefaultTCPMSS);
  //QUIC_DVLOG(3) << sender_ << " Rasing inflight_hi slope. probe_up_rounds:"
  //              << cycle_.probe_up_rounds
  //              << ", probe_up_bytes:" << cycle_.probe_up_bytes;
}